

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O2

void __thiscall
llama_model_loader::init_mappings(llama_model_loader *this,bool prefetch,llama_mlocks *mlock_mmaps)

{
  pointer puVar1;
  undefined8 uVar2;
  code *pcVar3;
  __uniq_ptr_data<llama_mlock,_std::default_delete<llama_mlock>,_true,_true> this_00;
  EVP_PKEY_CTX *ctx;
  long lVar4;
  _Base_ptr p_Var5;
  pointer puVar6;
  int local_6c;
  unique_ptr<llama_mlock,_std::default_delete<llama_mlock>_> mlock_mmap;
  unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_> mapping;
  
  if (this->use_mmap == true) {
    std::
    vector<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
    ::reserve(&this->mappings,
              (long)(this->files).
                    super__Vector_base<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->files).
                    super__Vector_base<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3);
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::reserve(&this->mmaps_used,
              (long)(this->files).
                    super__Vector_base<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->files).
                    super__Vector_base<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3);
    puVar1 = (this->files).
             super__Vector_base<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar6 = (this->files).
                  super__Vector_base<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar1; puVar6 = puVar6 + 1)
    {
      uVar2 = ggml_backend_dev_by_type(0);
      uVar2 = ggml_backend_dev_backend_reg(uVar2);
      pcVar3 = (code *)ggml_backend_reg_get_proc_address(uVar2,"ggml_backend_cpu_is_numa");
      mlock_mmap._M_t.super___uniq_ptr_impl<llama_mlock,_std::default_delete<llama_mlock>_>._M_t.
      super__Tuple_impl<0UL,_llama_mlock_*,_std::default_delete<llama_mlock>_>.
      super__Head_base<0UL,_llama_mlock_*,_false>._M_head_impl =
           (__uniq_ptr_data<llama_mlock,_std::default_delete<llama_mlock>,_true,_true>)
           (puVar6->_M_t).super___uniq_ptr_impl<llama_file,_std::default_delete<llama_file>_>._M_t.
           super__Tuple_impl<0UL,_llama_file_*,_std::default_delete<llama_file>_>.
           super__Head_base<0UL,_llama_file_*,_false>._M_head_impl;
      local_6c = -(uint)prefetch;
      (*pcVar3)();
      std::make_unique<llama_mmap,llama_file*,int,bool>
                ((llama_file **)&mapping,(int *)&mlock_mmap,(bool *)&local_6c);
      mlock_mmap._M_t.super___uniq_ptr_impl<llama_mlock,_std::default_delete<llama_mlock>_>._M_t.
      super__Tuple_impl<0UL,_llama_mlock_*,_std::default_delete<llama_mlock>_>.
      super__Head_base<0UL,_llama_mlock_*,_false>._M_head_impl =
           (__uniq_ptr_data<llama_mlock,_std::default_delete<llama_mlock>,_true,_true>)
           llama_mmap::size((llama_mmap *)
                            mapping._M_t.
                            super___uniq_ptr_impl<llama_mmap,_std::default_delete<llama_mmap>_>._M_t
                            .super__Tuple_impl<0UL,_llama_mmap_*,_std::default_delete<llama_mmap>_>.
                            super__Head_base<0UL,_llama_mmap_*,_false>._M_head_impl);
      local_6c = 0;
      std::
      vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
      ::emplace_back<unsigned_long,int>
                ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                  *)&this->mmaps_used,(unsigned_long *)&mlock_mmap,&local_6c);
      if (mlock_mmaps != (llama_mlocks *)0x0) {
        this_00.super___uniq_ptr_impl<llama_mlock,_std::default_delete<llama_mlock>_>._M_t.
        super__Tuple_impl<0UL,_llama_mlock_*,_std::default_delete<llama_mlock>_>.
        super__Head_base<0UL,_llama_mlock_*,_false>._M_head_impl =
             (__uniq_ptr_impl<llama_mlock,_std::default_delete<llama_mlock>_>)operator_new(8);
        llama_mlock::llama_mlock
                  ((llama_mlock *)
                   this_00.super___uniq_ptr_impl<llama_mlock,_std::default_delete<llama_mlock>_>.
                   _M_t.super__Tuple_impl<0UL,_llama_mlock_*,_std::default_delete<llama_mlock>_>.
                   super__Head_base<0UL,_llama_mlock_*,_false>._M_head_impl);
        mlock_mmap._M_t.super___uniq_ptr_impl<llama_mlock,_std::default_delete<llama_mlock>_>._M_t.
        super__Tuple_impl<0UL,_llama_mlock_*,_std::default_delete<llama_mlock>_>.
        super__Head_base<0UL,_llama_mlock_*,_false>._M_head_impl =
             (__uniq_ptr_data<llama_mlock,_std::default_delete<llama_mlock>,_true,_true>)
             (__uniq_ptr_data<llama_mlock,_std::default_delete<llama_mlock>,_true,_true>)
             this_00.super___uniq_ptr_impl<llama_mlock,_std::default_delete<llama_mlock>_>._M_t.
             super__Tuple_impl<0UL,_llama_mlock_*,_std::default_delete<llama_mlock>_>.
             super__Head_base<0UL,_llama_mlock_*,_false>._M_head_impl;
        ctx = (EVP_PKEY_CTX *)
              llama_mmap::addr((llama_mmap *)
                               mapping._M_t.
                               super___uniq_ptr_impl<llama_mmap,_std::default_delete<llama_mmap>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_llama_mmap_*,_std::default_delete<llama_mmap>_>
                               .super__Head_base<0UL,_llama_mmap_*,_false>._M_head_impl);
        llama_mlock::init((llama_mlock *)
                          this_00.
                          super___uniq_ptr_impl<llama_mlock,_std::default_delete<llama_mlock>_>._M_t
                          .super__Tuple_impl<0UL,_llama_mlock_*,_std::default_delete<llama_mlock>_>.
                          super__Head_base<0UL,_llama_mlock_*,_false>._M_head_impl,ctx);
        std::
        vector<std::unique_ptr<llama_mlock,std::default_delete<llama_mlock>>,std::allocator<std::unique_ptr<llama_mlock,std::default_delete<llama_mlock>>>>
        ::emplace_back<std::unique_ptr<llama_mlock,std::default_delete<llama_mlock>>>
                  ((vector<std::unique_ptr<llama_mlock,std::default_delete<llama_mlock>>,std::allocator<std::unique_ptr<llama_mlock,std::default_delete<llama_mlock>>>>
                    *)mlock_mmaps,&mlock_mmap);
        std::unique_ptr<llama_mlock,_std::default_delete<llama_mlock>_>::~unique_ptr(&mlock_mmap);
      }
      std::
      vector<std::unique_ptr<llama_mmap,std::default_delete<llama_mmap>>,std::allocator<std::unique_ptr<llama_mmap,std::default_delete<llama_mmap>>>>
      ::emplace_back<std::unique_ptr<llama_mmap,std::default_delete<llama_mmap>>>
                ((vector<std::unique_ptr<llama_mmap,std::default_delete<llama_mmap>>,std::allocator<std::unique_ptr<llama_mmap,std::default_delete<llama_mmap>>>>
                  *)&this->mappings,&mapping);
      std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>::~unique_ptr(&mapping);
    }
  }
  for (p_Var5 = (this->weights_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(this->weights_map)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var5)) {
    lVar4 = ggml_nbytes(p_Var5[2]._M_left);
    this->size_data = this->size_data + lVar4;
  }
  return;
}

Assistant:

void llama_model_loader::init_mappings(bool prefetch, llama_mlocks * mlock_mmaps) {
    if (use_mmap) {
        mappings.reserve(files.size());
        mmaps_used.reserve(files.size());
        for (const auto & file : files) {
            auto * reg = ggml_backend_dev_backend_reg(ggml_backend_dev_by_type(GGML_BACKEND_DEVICE_TYPE_CPU));
            auto * is_numa_fn = (decltype(ggml_is_numa) *) ggml_backend_reg_get_proc_address(reg, "ggml_backend_cpu_is_numa");
            std::unique_ptr<llama_mmap> mapping = std::make_unique<llama_mmap>(file.get(), prefetch ? -1 : 0, is_numa_fn());
            mmaps_used.emplace_back(mapping->size(), 0);
            if (mlock_mmaps) {
                std::unique_ptr<llama_mlock> mlock_mmap(new llama_mlock());
                mlock_mmap->init(mapping->addr());
                mlock_mmaps->emplace_back(std::move(mlock_mmap));
            }
            mappings.emplace_back(std::move(mapping));
        }
    }

    // compute the total size of all tensors for progress reporting
    for (const auto & it : weights_map) {
        size_data += ggml_nbytes(it.second.tensor);
    }
}